

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O3

int trie_node_clear(trie t,trie_node n)

{
  long lVar1;
  int iVar2;
  vector v;
  size_t sVar3;
  long *plVar4;
  set_value __ptr;
  trie_node_free_conflict ptVar5;
  set_iterator it;
  trie_node current_node;
  set_iterator local_48;
  trie_node local_40;
  trie_node local_38;
  
  local_38 = n;
  v = vector_create(8);
  vector_push_back(v,&local_38);
  sVar3 = vector_size(v);
  iVar2 = 0;
  if (sVar3 != 0) {
    do {
      plVar4 = (long *)vector_back(v);
      vector_pop_back(v);
      if ((plVar4 != (long *)0x0) && (lVar1 = *plVar4, lVar1 != 0)) {
        if (*(set *)(lVar1 + 0x20) != (set)0x0) {
          local_48 = set_iterator_begin(*(set *)(lVar1 + 0x20));
          while( true ) {
            iVar2 = set_iterator_end(&local_48);
            if (iVar2 < 1) break;
            __ptr = set_iterator_get_value(local_48);
            local_40 = t->node_list + *(long *)((long)__ptr + 8);
            vector_push_back(v,&local_40);
            free(__ptr);
            set_iterator_next(local_48);
          }
          set_destroy(*(set *)(lVar1 + 0x20));
        }
        ptVar5 = (trie_node_free_conflict)malloc(0x10);
        if (ptVar5 == (trie_node_free_conflict)0x0) {
          log_write_impl_va("metacall",0x278,"trie_node_clear",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,3,"Trie invalid free node allocation");
          iVar2 = 1;
          goto LAB_00104581;
        }
        ptVar5->next = t->free_node_list;
        ptVar5->index = *(size_t *)(lVar1 + 8);
        t->free_node_list = ptVar5;
        t->size = t->size - 1;
      }
      sVar3 = vector_size(v);
    } while (sVar3 != 0);
    iVar2 = 0;
  }
LAB_00104581:
  vector_destroy(v);
  return iVar2;
}

Assistant:

int trie_node_clear(trie t, trie_node n)
{
	if (t != NULL && n != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &n);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				trie_node_free free_node;

				if (back->childs != NULL)
				{
					set_iterator it;

					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);

						free(ref_node);
					}

					set_destroy(back->childs);
				}

				free_node = malloc(sizeof(struct trie_node_free_type));

				if (free_node == NULL)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid free node allocation");

					vector_destroy(node_stack);

					return 1;
				}

				free_node->next = t->free_node_list;

				free_node->index = back->self_index;

				t->free_node_list = free_node;

				--t->size;
			}
		}

		vector_destroy(node_stack);

		return 0;
	}

	return 1;
}